

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t cfd::core::ConfidentialTxIn::EstimateTxInVsize
                   (AddressType addr_type,Script *redeem_script,uint32_t pegin_btc_tx_size,
                   Script *claim_script,bool is_issuance,bool is_blind,bool is_reissuance,
                   Script *scriptsig_template,int exponent,int minimum_bits,
                   uint32_t *rangeproof_size,uint32_t txoutproof_size)

{
  uint32_t uVar1;
  Script local_b8;
  Script local_80;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t no_witness_size;
  uint32_t witness_size;
  bool is_reissuance_local;
  bool is_blind_local;
  bool is_issuance_local;
  Script *claim_script_local;
  Script *pSStack_28;
  uint32_t pegin_btc_tx_size_local;
  Script *redeem_script_local;
  AddressType addr_type_local;
  
  no_witness_size._1_1_ = is_reissuance;
  local_40 = 0;
  local_44 = 0;
  no_witness_size._2_1_ = is_blind;
  no_witness_size._3_1_ = is_issuance;
  _witness_size = claim_script;
  claim_script_local._4_4_ = pegin_btc_tx_size;
  pSStack_28 = redeem_script;
  redeem_script_local._4_4_ = addr_type;
  Script::Script(&local_80,redeem_script);
  uVar1 = claim_script_local._4_4_;
  Script::Script(&local_b8,claim_script);
  EstimateTxInSize(addr_type,&local_80,uVar1,&local_b8,(bool)(no_witness_size._3_1_ & 1),
                   (bool)(no_witness_size._2_1_ & 1),&local_40,&local_44,
                   (bool)(no_witness_size._1_1_ & 1),scriptsig_template,exponent,minimum_bits,
                   rangeproof_size,txoutproof_size);
  Script::~Script(&local_b8);
  Script::~Script(&local_80);
  uVar1 = AbstractTransaction::GetVsizeFromSize(local_44,local_40);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTxIn::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script, uint32_t pegin_btc_tx_size,
    Script claim_script, bool is_issuance, bool is_blind, bool is_reissuance,
    const Script *scriptsig_template, int exponent, int minimum_bits,
    uint32_t *rangeproof_size, uint32_t txoutproof_size) {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  ConfidentialTxIn::EstimateTxInSize(
      addr_type, redeem_script, pegin_btc_tx_size, claim_script, is_issuance,
      is_blind, &witness_size, &no_witness_size, is_reissuance,
      scriptsig_template, exponent, minimum_bits, rangeproof_size,
      txoutproof_size);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}